

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitIsop.c
# Opt level: O0

int Kit_TruthIsop(uint *puTruth,int nVars,Vec_Int_t *vMemory,int fTryBoth)

{
  int iVar1;
  uint *puVar2;
  int local_6c;
  int RetValue;
  uint *pResult;
  Kit_Sop_t *pcRes2;
  Kit_Sop_t cRes2;
  Kit_Sop_t *pcRes;
  Kit_Sop_t cRes;
  int fTryBoth_local;
  Vec_Int_t *vMemory_local;
  int nVars_local;
  uint *puTruth_local;
  
  cRes2.pCubes = (uint *)&pcRes;
  local_6c = 0;
  cRes.pCubes._4_4_ = fTryBoth;
  if ((-1 < nVars) && (nVars < 0x11)) {
    Vec_IntClear(vMemory);
    Vec_IntGrow(vMemory,0x100000);
    puVar2 = Kit_TruthIsop_rec(puTruth,puTruth,nVars,(Kit_Sop_t *)cRes2.pCubes,vMemory);
    if (cRes2.pCubes[1] == 0xffffffff) {
      vMemory->nSize = -1;
      puTruth_local._4_4_ = -1;
    }
    else {
      iVar1 = Kit_TruthIsEqual(puTruth,puVar2,nVars);
      if (iVar1 == 0) {
        __assert_fail("Kit_TruthIsEqual( puTruth, pResult, nVars )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitIsop.c"
                      ,0x9a,"int Kit_TruthIsop(unsigned int *, int, Vec_Int_t *, int)");
      }
      if ((cRes2.pCubes[1] == 0) || ((cRes2.pCubes[1] == 1 && (**(int **)(cRes2.pCubes + 2) == 0))))
      {
        *vMemory->pArray = 0;
        Vec_IntShrink(vMemory,cRes2.pCubes[1]);
        puTruth_local._4_4_ = 0;
      }
      else {
        if (cRes.pCubes._4_4_ != 0) {
          Kit_TruthNot(puTruth,puTruth,nVars);
          puVar2 = Kit_TruthIsop_rec(puTruth,puTruth,nVars,(Kit_Sop_t *)&pcRes2,vMemory);
          if (-1 < (int)pcRes2._4_4_) {
            iVar1 = Kit_TruthIsEqual(puTruth,puVar2,nVars);
            if (iVar1 == 0) {
              __assert_fail("Kit_TruthIsEqual( puTruth, pResult, nVars )",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitIsop.c"
                            ,0xa8,"int Kit_TruthIsop(unsigned int *, int, Vec_Int_t *, int)");
            }
            if (((int)pcRes2._4_4_ < (int)cRes2.pCubes[1]) ||
               ((cRes2.pCubes[1] == pcRes2._4_4_ && ((int)pcRes2 < (int)*cRes2.pCubes)))) {
              local_6c = 1;
              cRes2.pCubes = (uint *)&pcRes2;
            }
          }
          Kit_TruthNot(puTruth,puTruth,nVars);
        }
        memmove(vMemory->pArray,*(void **)(cRes2.pCubes + 2),(long)(int)cRes2.pCubes[1] << 2);
        Vec_IntShrink(vMemory,cRes2.pCubes[1]);
        puTruth_local._4_4_ = local_6c;
      }
    }
    return puTruth_local._4_4_;
  }
  __assert_fail("nVars >= 0 && nVars <= 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitIsop.c"
                ,0x8c,"int Kit_TruthIsop(unsigned int *, int, Vec_Int_t *, int)");
}

Assistant:

int Kit_TruthIsop( unsigned * puTruth, int nVars, Vec_Int_t * vMemory, int fTryBoth )
{
    Kit_Sop_t cRes, * pcRes = &cRes;
    Kit_Sop_t cRes2, * pcRes2 = &cRes2;
    unsigned * pResult;
    int RetValue = 0;
    assert( nVars >= 0 && nVars <= 16 );
    // if nVars < 5, make sure it does not depend on those vars
//    for ( i = nVars; i < 5; i++ )
//        assert( !Kit_TruthVarInSupport(puTruth, 5, i) );
    // prepare memory manager
    Vec_IntClear( vMemory );
    Vec_IntGrow( vMemory, KIT_ISOP_MEM_LIMIT );
    // compute ISOP for the direct polarity
    pResult = Kit_TruthIsop_rec( puTruth, puTruth, nVars, pcRes, vMemory );
    if ( pcRes->nCubes == -1 )
    {
        vMemory->nSize = -1;
        return -1;
    }
    assert( Kit_TruthIsEqual( puTruth, pResult, nVars ) );
    if ( pcRes->nCubes == 0 || (pcRes->nCubes == 1 && pcRes->pCubes[0] == 0) )
    {
        vMemory->pArray[0] = 0;
        Vec_IntShrink( vMemory, pcRes->nCubes );
        return 0;
    }
    if ( fTryBoth )
    {
        // compute ISOP for the complemented polarity
        Kit_TruthNot( puTruth, puTruth, nVars );
        pResult = Kit_TruthIsop_rec( puTruth, puTruth, nVars, pcRes2, vMemory );
        if ( pcRes2->nCubes >= 0 )
        {
            assert( Kit_TruthIsEqual( puTruth, pResult, nVars ) );
            if ( pcRes->nCubes > pcRes2->nCubes || (pcRes->nCubes == pcRes2->nCubes && pcRes->nLits > pcRes2->nLits) )
            {
                RetValue = 1;
                pcRes = pcRes2;
            }
        }
        Kit_TruthNot( puTruth, puTruth, nVars );
    }
//    printf( "%d ", vMemory->nSize );
    // move the cover representation to the beginning of the memory buffer
    memmove( vMemory->pArray, pcRes->pCubes, pcRes->nCubes * sizeof(unsigned) );
    Vec_IntShrink( vMemory, pcRes->nCubes );
    return RetValue;
}